

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

bool GlobOpt::IsTypeCheckProtected(Instr *instr)

{
  SymOpnd *this;
  SymOpnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  undefined4 *puVar4;
  PropertySymOpnd *this_01;
  SymOpnd *pSVar5;
  
  pSVar5 = (SymOpnd *)instr->m_dst;
  this = (SymOpnd *)instr->m_src2;
  if (pSVar5 != (SymOpnd *)0x0) {
    this_00 = (SymOpnd *)instr->m_src1;
    OVar2 = IR::Opnd::GetKind((Opnd *)pSVar5);
    if (OVar2 == OpndKindSym) {
      OVar2 = IR::Opnd::GetKind((Opnd *)pSVar5);
      if (OVar2 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_00495363;
        *puVar4 = 0;
      }
      bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
      if (this_00 != (SymOpnd *)0x0 && bVar3) {
        OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar2 == OpndKindSym) {
          OVar2 = IR::Opnd::GetKind((Opnd *)this_00);
          if (OVar2 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar4 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar3) goto LAB_00495363;
            *puVar4 = 0;
          }
          bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
          if (bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar4 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x58b,
                               "(!dst || !dst->IsSymOpnd() || !dst->AsSymOpnd()->IsPropertySymOpnd() || !src1 || !src1->IsSymOpnd() || !src1->AsSymOpnd()->IsPropertySymOpnd())"
                               ,"No instruction should have a src1 and dst be a PropertySymOpnd.");
            if (!bVar3) goto LAB_00495363;
            *puVar4 = 0;
          }
        }
      }
    }
  }
  if (this != (SymOpnd *)0x0) {
    OVar2 = IR::Opnd::GetKind((Opnd *)this);
    if (OVar2 == OpndKindSym) {
      OVar2 = IR::Opnd::GetKind((Opnd *)this);
      if (OVar2 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_00495363;
        *puVar4 = 0;
      }
      bVar3 = IR::SymOpnd::IsPropertySymOpnd(this);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x58c,
                           "(!src2 || !src2->IsSymOpnd() || !src2->AsSymOpnd()->IsPropertySymOpnd())"
                           ,"No instruction should have a src2 be a PropertySymOpnd.");
        if (!bVar3) goto LAB_00495363;
        *puVar4 = 0;
      }
    }
  }
  pSVar5 = (SymOpnd *)instr->m_dst;
  if (pSVar5 == (SymOpnd *)0x0) {
LAB_004952ac:
    pSVar5 = (SymOpnd *)instr->m_src1;
    if (pSVar5 != (SymOpnd *)0x0) {
      OVar2 = IR::Opnd::GetKind((Opnd *)pSVar5);
      if (OVar2 == OpndKindSym) {
        OVar2 = IR::Opnd::GetKind((Opnd *)pSVar5);
        if (OVar2 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar3) {
LAB_00495363:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
        if (bVar3) goto LAB_00495331;
      }
    }
    bVar3 = false;
  }
  else {
    OVar2 = IR::Opnd::GetKind((Opnd *)pSVar5);
    if (OVar2 != OpndKindSym) goto LAB_004952ac;
    OVar2 = IR::Opnd::GetKind((Opnd *)pSVar5);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_00495363;
      *puVar4 = 0;
    }
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (!bVar3) goto LAB_004952ac;
LAB_00495331:
    this_01 = IR::Opnd::AsPropertySymOpnd(&pSVar5->super_Opnd);
    bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
    bVar3 = (bool)(((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) >> 3 & bVar3);
  }
  return bVar3;
}

Assistant:

bool
GlobOpt::IsTypeCheckProtected(const IR::Instr * instr)
{
#if DBG
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    AssertMsg(!dst || !dst->IsSymOpnd() || !dst->AsSymOpnd()->IsPropertySymOpnd() ||
        !src1 || !src1->IsSymOpnd() || !src1->AsSymOpnd()->IsPropertySymOpnd(), "No instruction should have a src1 and dst be a PropertySymOpnd.");
    AssertMsg(!src2 || !src2->IsSymOpnd() || !src2->AsSymOpnd()->IsPropertySymOpnd(), "No instruction should have a src2 be a PropertySymOpnd.");
#endif

    IR::Opnd * opnd = instr->GetDst();
    if (opnd && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return opnd->AsPropertySymOpnd()->IsTypeCheckProtected();
    }
    opnd = instr->GetSrc1();
    if (opnd && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return opnd->AsPropertySymOpnd()->IsTypeCheckProtected();
    }
    return false;
}